

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Wrd_t *vFuncs;
  word *__s;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  char *p_00;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  word *pwVar18;
  uint uVar19;
  uint uVar20;
  int nDCs [32];
  int local_b8 [34];
  
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x1f] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  bVar6 = (byte)nOuts;
  uVar14 = 1 << (bVar6 & 0x1f);
  uVar11 = vRel->nSize;
  uVar3 = (int)uVar11 / (int)uVar14;
  uVar2 = nOuts * uVar3 * 2;
  vFuncs = (Vec_Wrd_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < nOuts * uVar3 * 2 - 1) {
    uVar7 = uVar2;
  }
  vFuncs->nSize = 0;
  vFuncs->nCap = uVar7;
  if (uVar7 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar7 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = uVar2;
  lVar4 = (long)(int)uVar2;
  memset(__s,0,lVar4 * 8);
  if ((uVar11 & uVar14 - 1) != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x332,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x333,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  uVar11 = uVar3 * 0x40;
  if ((int)uVar3 < 1) {
    uVar17 = 0;
  }
  else {
    uVar7 = 1;
    if (1 < (int)uVar14) {
      uVar7 = uVar14;
    }
    uVar8 = (ulong)uVar3;
    uVar13 = 1;
    if (1 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar5 = 0;
    uVar17 = 0;
    do {
      uVar19 = 0;
      uVar20 = uVar19;
      if (nOuts != 0x1f) {
        do {
          uVar1 = ((int)uVar5 << (bVar6 & 0x1f)) + uVar19;
          uVar20 = uVar19;
          if ((vRel->pArray[(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) break;
          uVar19 = uVar19 + 1;
          uVar20 = uVar7;
        } while (uVar7 != uVar19);
      }
      if (0 < nOuts) {
        uVar12 = 1L << ((byte)uVar5 & 0x3f);
        pwVar18 = vRel->pArray;
        uVar15 = 0;
        uVar9 = 0;
        do {
          uVar19 = (uVar20 ^ 1 << ((uint)uVar9 & 0x1f)) + ((int)uVar5 << (bVar6 & 0x1f));
          if ((pwVar18[(int)uVar19 >> 6] >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
            if ((1 << ((byte)uVar9 & 0x1f) & uVar20) == 0) {
              if (uVar2 <= uVar15) goto LAB_007baccf;
              __s[(uVar5 >> 6) + uVar15] = __s[(uVar5 >> 6) + uVar15] | uVar12;
            }
            else {
              if ((ulong)uVar2 <= uVar8 + uVar15) goto LAB_007baccf;
              __s[uVar8 + (uVar5 >> 6) + uVar15] = __s[uVar8 + (uVar5 >> 6) + uVar15] | uVar12;
            }
          }
          else {
            local_b8[uVar9] = local_b8[uVar9] + 1;
          }
          uVar9 = uVar9 + 1;
          uVar15 = uVar15 + uVar8 * 2;
        } while ((uint)nOuts != uVar9);
      }
      uVar17 = (ulong)((int)uVar17 + (uint)(uVar20 == uVar14));
      uVar5 = uVar5 + 1;
    } while ((uint)uVar5 != uVar13);
  }
  if ((int)uVar17 == 0) {
    printf("The relation was successfully determized with don\'t-cares for %d patterns.\n",
           (ulong)uVar11);
    if (0 < nOuts) {
      lVar16 = (long)(int)uVar3;
      pwVar18 = __s + lVar16;
      uVar17 = 0;
      do {
        lVar10 = uVar17 * 2 * lVar16;
        if ((lVar10 < 0) || (lVar4 <= lVar10)) {
LAB_007baccf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if ((int)uVar3 < 1) {
          uVar8 = 0;
        }
        else {
          uVar5 = 0;
          uVar8 = 0;
          do {
            uVar9 = __s[uVar5] - (__s[uVar5] >> 1 & 0x5555555555555555);
            uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
            uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f;
            uVar9 = (uVar9 >> 8) + uVar9;
            lVar10 = (uVar9 >> 0x10) + uVar9;
            uVar8 = (ulong)((int)uVar8 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU));
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        lVar10 = (uVar17 * 2 | 1) * lVar16;
        if ((lVar10 < 0) || (lVar4 <= lVar10)) goto LAB_007baccf;
        if ((int)uVar3 < 1) {
          uVar5 = 0;
        }
        else {
          uVar9 = 0;
          uVar5 = 0;
          do {
            uVar12 = pwVar18[uVar9] - (pwVar18[uVar9] >> 1 & 0x5555555555555555);
            uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
            uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
            uVar12 = (uVar12 >> 8) + uVar12;
            lVar10 = (uVar12 >> 0x10) + uVar12;
            uVar5 = (ulong)((int)uVar5 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU));
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        printf("%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n",
               SUB84(((double)local_b8[uVar17] * 100.0) / (double)(int)uVar11,0),uVar17 & 0xffffffff
               ,uVar8,uVar5);
        uVar17 = uVar17 + 1;
        __s = __s + lVar16 * 2;
        pwVar18 = pwVar18 + lVar16 * 2;
      } while (uVar17 != (uint)nOuts);
    }
    p_00 = (char *)0xa;
    putchar(10);
  }
  else {
    p_00 = "The relation is not well-defined for %d (out of %d) patterns.\n";
    printf("The relation is not well-defined for %d (out of %d) patterns.\n",uVar17,(ulong)uVar11);
  }
  Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_00,vRel,nOuts,vFuncs);
  return vFuncs;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, nDCs[32] = {0}, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
        {
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+(m^(1<<k)) ) )
            {
                nDCs[k]++;
                continue;
            }
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
        }
        if ( 0 )
        {
            for ( m = 0; m < nMints; m++ )
                printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            printf( " " );
            for ( k = 0; k < nOuts; k++ )
            {
                if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i ) )
                    printf( "0" );
                else if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i ) )
                    printf( "1" );
                else
                    printf( "-" );
            }
            printf( "\n" );
        }
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
    {
        printf( "The relation was successfully determized with don't-cares for %d patterns.\n", 64 * nWords );
        for ( k = 0; k < nOuts; k++ )
        {
            int nOffs = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), nWords );
            int nOns  = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), nWords );
            printf( "%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n", k, nOffs, nOns, nDCs[k], 100.0*nDCs[k]/(64*nWords) );
        }
        printf( "\n" );
    }
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}